

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11_init.c
# Opt level: O0

Atom getSupportedAtom(Atom *supportedAtoms,unsigned_long atomCount,char *atomName)

{
  Atom AVar1;
  undefined8 in_RDX;
  ulong in_RSI;
  long in_RDI;
  Atom atom;
  unsigned_long i;
  ulong local_28;
  
  AVar1 = XInternAtom(_glfw.x11.display,in_RDX,0);
  local_28 = 0;
  while( true ) {
    if (in_RSI <= local_28) {
      return 0;
    }
    if (*(Atom *)(in_RDI + local_28 * 8) == AVar1) break;
    local_28 = local_28 + 1;
  }
  return AVar1;
}

Assistant:

static Atom getSupportedAtom(Atom* supportedAtoms,
                             unsigned long atomCount,
                             const char* atomName)
{
    unsigned long i;
    const Atom atom = XInternAtom(_glfw.x11.display, atomName, False);

    for (i = 0;  i < atomCount;  i++)
    {
        if (supportedAtoms[i] == atom)
            return atom;
    }

    return None;
}